

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O3

int rdacc_den_full(char *dir,vector_t ****inout_wt_mean,vector_t *****inout_wt_var,
                  int32 *inout_pass2var,float32 ****inout_dnom,uint32 *inout_n_mgau,
                  uint32 *inout_n_stream,uint32 *inout_n_density,uint32 **inout_veclen)

{
  float32 ***out;
  int iVar1;
  uint32 uVar2;
  char *out_n_feat;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32 n_stream;
  uint32 n_density;
  uint32 n_mgau;
  int32 pass2var;
  uint32 *in_veclen;
  vector_t ****in_wt_var;
  vector_t ***in_wt_mean;
  float32 ***in_dnom;
  char fn [4097];
  uint32 local_1078;
  uint32 local_1074;
  uint local_1070;
  int32 local_106c;
  uint32 *local_1068;
  vector_t ****local_1060;
  vector_t ***local_1058;
  vector_t ****local_1050;
  float32 ***local_1048;
  vector_t ***local_1040;
  char local_1038 [4104];
  
  sprintf(local_1038,"%s/gauden_counts",dir);
  out_n_feat = (char *)&local_1078;
  iVar1 = s3gaucnt_read_full(local_1038,&local_1058,&local_1060,&local_106c,&local_1048,&local_1070,
                             (uint32 *)out_n_feat,&local_1074,&local_1068);
  if (iVar1 == 0) {
    local_1040 = *inout_wt_mean;
    local_1050 = *inout_wt_var;
    if (local_1040 == (vector_t ***)0x0) {
      *inout_wt_mean = local_1058;
      *inout_dnom = local_1048;
      *inout_n_mgau = local_1070;
      *inout_n_stream = local_1078;
      *inout_n_density = local_1074;
      *inout_veclen = local_1068;
      *inout_pass2var = local_106c;
      iVar1 = 0;
      if (local_1060 != (vector_t ****)0x0 && local_1050 == (vector_t ****)0x0) {
        *inout_wt_var = local_1060;
      }
    }
    else {
      out = *inout_dnom;
      uVar2 = *inout_n_mgau;
      bVar5 = uVar2 != local_1070;
      if (bVar5) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar2);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x16e,"# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",local_1038,
                (ulong)local_1070,out_n_feat);
      }
      uVar2 = *inout_n_stream;
      bVar6 = uVar2 != local_1078;
      if (bVar6) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar2);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x175,"# stream for file %s (== %u) != prior # stream (== %u)\n",local_1038,
                (ulong)local_1078,out_n_feat);
      }
      uVar2 = *inout_n_density;
      bVar7 = uVar2 != local_1074;
      if (bVar7) {
        out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar2);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x17c,"# density comp/mix for file %s (== %u) != prior # density, %u\n",local_1038,
                (ulong)local_1074,out_n_feat);
      }
      bVar7 = bVar7 || (bVar6 || bVar5);
      if (*inout_pass2var != local_106c) {
        out_n_feat = "true";
        pcVar4 = "true";
        if (local_106c == 0) {
          pcVar4 = "false";
        }
        if (*inout_pass2var == 0) {
          out_n_feat = "false";
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x183,"2 pass var %s in %s, but %s in others.\n",local_1038,pcVar4,out_n_feat);
        bVar7 = true;
      }
      if (local_1078 != 0) {
        uVar3 = 0;
        uVar2 = local_1078;
        do {
          if ((*inout_veclen)[uVar3] != local_1068[uVar3]) {
            out_n_feat = (char *)CONCAT44((int)((ulong)out_n_feat >> 0x20),(*inout_veclen)[uVar3]);
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                    ,0x18b,"vector length of stream %u (== %u) != prior length (== %u)\n",
                    uVar3 & 0xffffffff,(ulong)local_1068[uVar3],out_n_feat);
            bVar7 = true;
            uVar2 = local_1078;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar2);
      }
      ckd_free(local_1068);
      iVar1 = -1;
      if (!bVar7) {
        accum_3d(out,local_1048,local_1070,local_1078,local_1074);
        gauden_accum_param(local_1040,local_1058,local_1070,local_1078,local_1074,*inout_veclen);
        gauden_free_param(local_1058);
        iVar1 = 0;
        if (local_1050 != (vector_t ****)0x0) {
          if (local_1060 == (vector_t ****)0x0) {
            __assert_fail("in_wt_var",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                          ,0x19d,
                          "int rdacc_den_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                         );
          }
          gauden_accum_param_full
                    (local_1050,local_1060,local_1070,local_1078,local_1074,*inout_veclen);
          gauden_free_param_full(local_1060);
          iVar1 = 0;
        }
      }
    }
  }
  else {
    rdacc_den_full_cold_1();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
rdacc_den_full(const char *dir,
               vector_t **** inout_wt_mean,
               vector_t ***** inout_wt_var,
               int32 * inout_pass2var,
               float32 **** inout_dnom,
               uint32 * inout_n_mgau,
               uint32 * inout_n_stream,
               uint32 * inout_n_density, uint32 ** inout_veclen)
{
    char fn[MAXPATHLEN + 1];
    vector_t ***in_wt_mean;
    vector_t ***wt_mean;
    vector_t ****in_wt_var;
    vector_t ****wt_var;
    float32 ***in_dnom;
    float32 ***dnom;
    uint32 n_mgau;
    uint32 n_stream;
    uint32 n_density;
    uint32 *in_veclen;
    int32 pass2var;
    int i;

    sprintf(fn, "%s/gauden_counts", dir);

    if (s3gaucnt_read_full(fn,
                           &in_wt_mean,
                           &in_wt_var,
                           &pass2var,
                           &in_dnom,
                           &n_mgau,
                           &n_stream,
                           &n_density, &in_veclen) != S3_SUCCESS) {
        fflush(stdout);
        perror(fn);

        return S3_ERROR;
    }

    wt_mean = *inout_wt_mean;
    wt_var = *inout_wt_var;
    dnom = *inout_dnom;

    if (wt_mean == NULL) {
        /* if a gauden_counts file exists, it will have reestimated means */
        *inout_wt_mean = wt_mean = in_wt_mean;
        *inout_dnom = dnom = in_dnom;
        *inout_n_mgau = n_mgau;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
        *inout_veclen = in_veclen;
        *inout_pass2var = pass2var;

        if (wt_var == NULL && in_wt_var != NULL) {
            *inout_wt_var = wt_var = in_wt_var;
        }
    }
    else {
        int err = FALSE;

        /* check if matrices are able to be added */
        if (*inout_n_mgau != n_mgau) {
            E_ERROR
                ("# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",
                 fn, n_mgau, *inout_n_mgau);
            err = TRUE;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream for file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            err = TRUE;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix for file %s (== %u) != prior # density, %u\n",
                 fn, n_density, *inout_n_density);
            err = TRUE;
        }

        if (*inout_pass2var != pass2var) {
            E_ERROR("2 pass var %s in %s, but %s in others.\n",
                    fn, (pass2var ? "true" : "false"),
                    (*inout_pass2var ? "true" : "false"));
            err = TRUE;
        }

        for (i = 0; i < n_stream; i++) {
            if ((*inout_veclen)[i] != in_veclen[i]) {
                E_ERROR
                    ("vector length of stream %u (== %u) != prior length (== %u)\n",
                     i, in_veclen[i], (*inout_veclen)[i]);
                err = TRUE;
            }
        }

        ckd_free(in_veclen);

        if (err)
            return S3_ERROR;

        /* accumulate values */
        accum_3d(dnom, in_dnom, n_mgau, n_stream, n_density);

        gauden_accum_param(wt_mean, in_wt_mean,
                           n_mgau, n_stream, n_density, *inout_veclen);
        gauden_free_param(in_wt_mean);

        if (wt_var) {
            assert(in_wt_var);

            gauden_accum_param_full(wt_var, in_wt_var,
                                    n_mgau, n_stream, n_density,
                                    *inout_veclen);
            gauden_free_param_full(in_wt_var);
        }
    }

    return S3_SUCCESS;
}